

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

LogEst sqlite3LogEstAdd(LogEst a,LogEst b)

{
  undefined2 in_register_00000032;
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,a);
  if (a < b) {
    if (CONCAT22(in_register_00000032,b) <= iVar1 + 0x31) {
      if (iVar1 + 0x1f < CONCAT22(in_register_00000032,b)) {
        return b + 1;
      }
      return (ushort)"\n\n\t\t\b\b\a\a\a\x06\x06\x06\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02"
                     [CONCAT22(in_register_00000032,b) - iVar1] + b;
    }
    iVar1 = CONCAT22(in_register_00000032,b);
  }
  else if (iVar1 <= CONCAT22(in_register_00000032,b) + 0x31) {
    if (CONCAT22(in_register_00000032,b) + 0x1f < iVar1) {
      return a + 1;
    }
    return a + (ushort)"\n\n\t\t\b\b\a\a\a\x06\x06\x06\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02"
                       [iVar1 - CONCAT22(in_register_00000032,b)];
  }
  return (LogEst)iVar1;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEstAdd(LogEst a, LogEst b){
  static const unsigned char x[] = {
     10, 10,                         /* 0,1 */
      9, 9,                          /* 2,3 */
      8, 8,                          /* 4,5 */
      7, 7, 7,                       /* 6,7,8 */
      6, 6, 6,                       /* 9,10,11 */
      5, 5, 5,                       /* 12-14 */
      4, 4, 4, 4,                    /* 15-18 */
      3, 3, 3, 3, 3, 3,              /* 19-24 */
      2, 2, 2, 2, 2, 2, 2,           /* 25-31 */
  };
  if( a>=b ){
    if( a>b+49 ) return a;
    if( a>b+31 ) return a+1;
    return a+x[a-b];
  }else{
    if( b>a+49 ) return b;
    if( b>a+31 ) return b+1;
    return b+x[b-a];
  }
}